

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

bool __thiscall cmGlobalGenerator::ComputeTargetDepends(cmGlobalGenerator *this)

{
  cmTarget *t;
  bool bVar1;
  mapped_type *deps;
  pointer __k;
  cmComputeTargetDepends ctd;
  cmComputeTargetDepends local_e0;
  
  cmComputeTargetDepends::cmComputeTargetDepends(&local_e0,this);
  bVar1 = cmComputeTargetDepends::Compute(&local_e0);
  if ((bVar1) &&
     (local_e0.Targets.super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_e0.Targets.super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    __k = local_e0.Targets.super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_start;
    do {
      t = *__k;
      deps = std::
             map<const_cmTarget_*,_cmTargetDependSet,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetDependSet>_>_>
             ::operator[](&this->TargetDependencies,__k);
      cmComputeTargetDepends::GetTargetDirectDepends(&local_e0,t,deps);
      __k = __k + 1;
    } while (__k != local_e0.Targets.
                    super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  cmComputeTargetDepends::~cmComputeTargetDepends(&local_e0);
  return bVar1;
}

Assistant:

bool cmGlobalGenerator::ComputeTargetDepends()
{
  cmComputeTargetDepends ctd(this);
  if(!ctd.Compute())
    {
    return false;
    }
  std::vector<cmTarget const*> const& targets = ctd.GetTargets();
  for(std::vector<cmTarget const*>::const_iterator ti = targets.begin();
      ti != targets.end(); ++ti)
    {
    ctd.GetTargetDirectDepends(*ti, this->TargetDependencies[*ti]);
    }
  return true;
}